

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O1

ssh_cipher * aes_ni_new(ssh_cipheralg *alg)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  undefined1 uVar3;
  void *pvVar4;
  ssh_cipher *psVar5;
  ulong uVar6;
  
  puVar1 = (undefined8 *)alg->extra;
  if (*(char *)puVar1[1] == '\0') {
    uVar3 = (*(code *)*puVar1)();
    puVar2 = (undefined1 *)puVar1[1];
    puVar2[1] = uVar3;
    *puVar2 = 1;
  }
  if (*(char *)(puVar1[1] + 1) == '\x01') {
    pvVar4 = safemalloc(0x20f,1,0);
    uVar6 = (long)pvVar4 + 0xfU & 0xfffffffffffffff0;
    psVar5 = (ssh_cipher *)(uVar6 + 0x1f8);
    *(ssh_cipheralg **)(uVar6 + 0x1f8) = alg;
    *(void **)(uVar6 + 0x1f0) = pvVar4;
  }
  else {
    psVar5 = (ssh_cipher *)0x0;
  }
  return psVar5;
}

Assistant:

static ssh_cipher *aes_ni_new(const ssh_cipheralg *alg)
{
    const struct aes_extra *extra = (const struct aes_extra *)alg->extra;
    if (!check_availability(extra))
        return NULL;

    /*
     * The __m128i variables in the context structure need to be
     * 16-byte aligned, but not all malloc implementations that this
     * code has to work with will guarantee to return a 16-byte
     * aligned pointer. So we over-allocate, manually realign the
     * pointer ourselves, and store the original one inside the
     * context so we know how to free it later.
     */
    void *allocation = smalloc(sizeof(aes_ni_context) + 15);
    uintptr_t alloc_address = (uintptr_t)allocation;
    uintptr_t aligned_address = (alloc_address + 15) & ~15;
    aes_ni_context *ctx = (aes_ni_context *)aligned_address;

    ctx->ciph.vt = alg;
    ctx->pointer_to_free = allocation;
    return &ctx->ciph;
}